

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::insert
          (SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this,TypeBase **key)

{
  uint uVar1;
  TypeBase **ppTVar2;
  TypeBase **item;
  uint i;
  uint local_1c;
  uint bucket;
  uint bucketMask;
  TypeBase **key_local;
  SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this_local;
  
  _bucket = key;
  key_local = (TypeBase **)this;
  if (*key == (TypeBase *)0x0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0xd9,
                  "void SmallDenseSet<TypeBase *, TypeBaseHasher, 4>::insert(const Key &) [Key = TypeBase *, Hasher = TypeBaseHasher, N = 4]"
                 );
  }
  if (this->bucketCount <= this->count + (this->count >> 2)) {
    rehash(this);
  }
  local_1c = this->bucketCount - 1;
  uVar1 = TypeBaseHasher::operator()((TypeBaseHasher *)((long)&item + 7),*_bucket);
  item._0_4_ = 0;
  while( true ) {
    i = uVar1 & local_1c;
    if (this->bucketCount <= (uint)item) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0xf5,
                    "void SmallDenseSet<TypeBase *, TypeBaseHasher, 4>::insert(const Key &) [Key = TypeBase *, Hasher = TypeBaseHasher, N = 4]"
                   );
    }
    ppTVar2 = this->data + i;
    if (*ppTVar2 == (TypeBase *)0x0) break;
    if (*ppTVar2 == *_bucket) {
      return;
    }
    uVar1 = i + (uint)item + 1;
    item._0_4_ = (uint)item + 1;
  }
  *ppTVar2 = *_bucket;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
			{
				item = key;

				count++;
				return;
			}

			if(item == key)
				return;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}